

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce(ChElementHexaANCF_3843 *this)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar3;
  double *pdVar4;
  undefined1 (*pauVar5) [64];
  Index j;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Index outer;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  VectorN Sxi_compact;
  ChMatrixNM<double,_NSF,_NSF> MassMatrixCompactSquare;
  type tmp;
  add_assign_op<double,_double> local_41f9;
  ulong local_41f8;
  ulong local_41f0;
  undefined1 *local_41e8;
  double local_41e0;
  double local_41d8;
  double local_41d0;
  double local_41c8;
  double local_41c0;
  double local_41b8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_> local_41b0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_> local_41a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_41a0;
  undefined1 local_4180 [128];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [8192];
  undefined1 local_2080 [192];
  undefined1 local_1fc0 [8080];
  
  local_41e8 = local_4080;
  memset(local_41e8,0,0x2000);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[9] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xb] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xc] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xd] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xe] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xf] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x11] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x12] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x13] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x14] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x15] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x16] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x17] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x18] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x19] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1a] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1b] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1c] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1d] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1e] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1f] = 0.0;
  peVar2 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_41e0 = peVar2->m_rho;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
    local_41f8 = 0;
    do {
      if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
        local_41f0 = 0;
        do {
          lVar6 = *(long *)(DAT_00b92c40 + 0x48);
          if (*(long *)(DAT_00b92c40 + 0x50) != lVar6) {
            uVar7 = 0;
            do {
              lVar9 = *(long *)(static_tables_3843 + 0x48);
              local_41b8 = *(double *)(lVar9 + local_41f8 * 8) * *(double *)(lVar9 + local_41f0 * 8)
                           * *(double *)(lVar9 + uVar7 * 8) * local_41e0;
              local_41c8 = *(double *)(lVar6 + local_41f8 * 8);
              local_41d0 = *(double *)(lVar6 + local_41f0 * 8);
              local_41d8 = *(double *)(lVar6 + uVar7 * 8);
              local_41c0 = Calc_det_J_0xi(this,local_41c8,local_41d0,local_41d8);
              Calc_Sxi_compact(this,(VectorN *)local_4180,local_41c8,local_41d0,local_41d8);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = local_41c0 * local_41b8;
              auVar10 = vbroadcastsd_avx512f(auVar16);
              auVar11 = vmulpd_avx512f(auVar10,local_4180._0_64_);
              auVar12 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])
                                                (this->m_GravForceScale).
                                                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                                .m_storage.m_data.array);
              *(undefined1 (*) [64])
               (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
                   = auVar12;
              auVar12 = vmulpd_avx512f(auVar10,local_4180._64_64_);
              auVar13 = vaddpd_avx512f(auVar12,*(undefined1 (*) [64])
                                                ((this->m_GravForceScale).
                                                 super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                                 .m_storage.m_data.array + 8));
              *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                array + 8) = auVar13;
              auVar13 = vmulpd_avx512f(auVar10,local_4100);
              auVar14 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])
                                                ((this->m_GravForceScale).
                                                 super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                                 .m_storage.m_data.array + 0x10));
              *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                array + 0x10) = auVar14;
              auVar10 = vmulpd_avx512f(auVar10,local_40c0);
              auVar14 = vaddpd_avx512f(auVar10,*(undefined1 (*) [64])
                                                ((this->m_GravForceScale).
                                                 super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                                 .m_storage.m_data.array + 0x18));
              *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                array + 0x18) = auVar14;
              pauVar5 = (undefined1 (*) [64])local_1fc0;
              lVar6 = 0;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = *(ulong *)(local_4180 + lVar6 * 8);
                auVar14 = vbroadcastsd_avx512f(auVar1);
                auVar15 = vmulpd_avx512f(auVar11,auVar14);
                pauVar5[-3] = auVar15;
                auVar15 = vmulpd_avx512f(auVar12,auVar14);
                pauVar5[-2] = auVar15;
                auVar15 = vmulpd_avx512f(auVar13,auVar14);
                pauVar5[-1] = auVar15;
                auVar14 = vmulpd_avx512f(auVar10,auVar14);
                *pauVar5 = auVar14;
                lVar6 = lVar6 + 1;
                pauVar5 = pauVar5 + 4;
              } while (lVar6 != 0x20);
              local_41a8.m_d.data = (plainobjectbase_evaluator_data<double,_32>)local_2080;
              local_41b0.m_d.data = (plainobjectbase_evaluator_data<double,_32>)local_4080;
              local_41a0.m_dst = (DstEvaluatorType *)&local_41b0;
              local_41a0.m_src = (SrcEvaluatorType *)&local_41a8;
              local_41a0.m_functor = &local_41f9;
              lVar9 = 0;
              lVar6 = 0;
              local_41a0.m_dstExpr = (DstXprType *)local_41b0.m_d.data;
              do {
                pdVar3 = ((local_41a0.m_dst)->
                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>
                         ).m_d.data;
                pdVar4 = ((local_41a0.m_src)->
                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_>
                         ).m_d.data;
                *(double *)((long)pdVar3 + lVar9) =
                     pdVar4[lVar6] + *(double *)((long)pdVar3 + lVar9);
                *(double *)((long)pdVar3 + lVar9 + 8) =
                     pdVar4[lVar6 + 0x20] + *(double *)((long)pdVar3 + lVar9 + 8);
                *(double *)((long)pdVar3 + lVar9 + 0x10) =
                     pdVar4[lVar6 + 0x40] + *(double *)((long)pdVar3 + lVar9 + 0x10);
                *(double *)((long)pdVar3 + lVar9 + 0x18) =
                     pdVar4[lVar6 + 0x60] + *(double *)((long)pdVar3 + lVar9 + 0x18);
                *(double *)((long)pdVar3 + lVar9 + 0x20) =
                     pdVar4[lVar6 + 0x80] + *(double *)((long)pdVar3 + lVar9 + 0x20);
                *(double *)((long)pdVar3 + lVar9 + 0x28) =
                     pdVar4[lVar6 + 0xa0] + *(double *)((long)pdVar3 + lVar9 + 0x28);
                Eigen::internal::
                copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_6,_32>
                ::run(&local_41a0,lVar6);
                lVar6 = lVar6 + 1;
                lVar9 = lVar9 + 0x100;
              } while (lVar6 != 0x20);
              uVar7 = (ulong)((int)uVar7 + 1);
              lVar6 = *(long *)(DAT_00b92c40 + 0x48);
            } while (uVar7 < (ulong)(*(long *)(DAT_00b92c40 + 0x50) - lVar6 >> 3));
          }
          local_41f0 = (ulong)((int)local_41f0 + 1);
        } while (local_41f0 <
                 (ulong)(*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48) >> 3));
      }
      local_41f8 = (ulong)((int)local_41f8 + 1);
    } while (local_41f8 <
             (ulong)(*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48) >> 3));
  }
  lVar6 = 0;
  uVar7 = 0;
  do {
    uVar8 = uVar7;
    if ((uint)uVar7 < 0x211) {
      uVar8 = 0x210;
    }
    lVar9 = 0;
    do {
      if (uVar8 - uVar7 == lVar9) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>.
      m_storage.m_data.array[uVar7 + lVar9] = *(double *)(local_41e8 + lVar9 * 8);
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 + (int)lVar6 != 0x20);
    lVar6 = lVar6 + 1;
    local_41e8 = local_41e8 + 0x108;
    uVar7 = (ulong)((uint)uVar7 + (int)lVar9);
  } while (lVar6 != 0x20);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 7 in xi, 7 in eta, and 7 in zeta.
    // 4 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = 3;  // 4 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}